

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_dns.c
# Opt level: O2

int main(void)

{
  sunrealtype sVar1;
  int iVar2;
  int iVar3;
  void *returnvalue;
  void *returnvalue_00;
  void *returnvalue_01;
  undefined8 *puVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  void *returnvalue_02;
  void *returnvalue_03;
  void *returnvalue_04;
  FILE *__stream;
  long *plVar7;
  undefined8 uVar8;
  uint uVar9;
  double dVar10;
  int retval;
  int retval_1;
  double local_a0;
  SUNContext ctx;
  int local_8c;
  int retvalr;
  int kused;
  void *local_80;
  void *local_78;
  void *local_70;
  int rootsfound [2];
  sunrealtype tret;
  sunrealtype hused;
  long nst;
  
  retval = SUNContext_Create(0,&ctx);
  iVar3 = 1;
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    returnvalue = (void *)N_VNew_Serial(3,ctx);
    iVar2 = check_retval(returnvalue,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      returnvalue_00 = (void *)N_VClone(returnvalue);
      iVar2 = check_retval(returnvalue_00,"N_VNew_Serial",0);
      if (iVar2 == 0) {
        returnvalue_01 = (void *)N_VClone(returnvalue);
        iVar2 = check_retval(returnvalue_01,"N_VNew_Serial",0);
        if (iVar2 == 0) {
          puVar4 = (undefined8 *)N_VGetArrayPointer(returnvalue);
          *puVar4 = 0x3ff0000000000000;
          puVar4[1] = 0;
          puVar4[2] = 0;
          puVar5 = (undefined4 *)N_VGetArrayPointer(returnvalue_00);
          *puVar5 = 0x47ae147b;
          puVar5[1] = 0xbfa47ae1;
          puVar5[2] = 0x47ae147b;
          puVar5[3] = 0x3fa47ae1;
          *(undefined8 *)(puVar5 + 4) = 0;
          puVar5 = (undefined4 *)N_VGetArrayPointer(returnvalue_01);
          *puVar5 = 0xe2308c3a;
          puVar5[1] = 0x3e45798e;
          puVar5[2] = 0xa0b5ed8d;
          puVar5[3] = 0x3eb0c6f7;
          *(undefined8 *)(puVar5 + 4) = 0x3eb0c6f7a0b5ed8d;
          puVar4 = (undefined8 *)N_VGetArrayPointer(returnvalue_01);
          puVar6 = (undefined8 *)N_VGetArrayPointer(returnvalue);
          puts("\nidasRoberts_dns: Robertson kinetics DAE serial example problem for IDA.");
          puts("               Three equation chemical kinetics problem.\n");
          puts("Linear solver: DENSE, with user-supplied Jacobian.");
          printf("Tolerance parameters:  rtol = %g   atol = %g %g %g \n",0xeb1c432d,*puVar4,
                 puVar4[1],puVar4[2]);
          printf("Initial conditions y0 = (%g %g %g)\n",(int)*puVar6,puVar6[1],puVar6[2]);
          puts("Constraints and id not used.\n");
          puts("-----------------------------------------------------------------------");
          printf("  t             y1           y2           y3");
          puts("      | nst  k      h");
          puts("-----------------------------------------------------------------------");
          returnvalue_02 = (void *)IDACreate(ctx);
          local_70 = returnvalue_02;
          iVar2 = check_retval(returnvalue_02,"IDACreate",0);
          if (iVar2 == 0) {
            retval = IDAInit(0,returnvalue_02,resrob,returnvalue,returnvalue_00);
            iVar2 = check_retval(&retval,"IDAInit",1);
            iVar3 = 1;
            if (iVar2 == 0) {
              retval = IDASVtolerances(0xeb1c432d,returnvalue_02,returnvalue_01);
              iVar2 = check_retval(&retval,"IDASVtolerances",1);
              iVar3 = 1;
              if (iVar2 == 0) {
                retval = IDARootInit(returnvalue_02,2,grob);
                iVar3 = 1;
                iVar2 = check_retval(&retval,"IDARootInit",1);
                if (iVar2 == 0) {
                  returnvalue_03 = (void *)SUNDenseMatrix(3,3,ctx);
                  iVar2 = check_retval(returnvalue_03,"SUNDenseMatrix",0);
                  if (iVar2 == 0) {
                    returnvalue_04 = (void *)SUNLinSol_Dense(returnvalue,returnvalue_03,ctx);
                    local_78 = returnvalue_03;
                    iVar2 = check_retval(returnvalue_04,"SUNLinSol_Dense",0);
                    if (iVar2 == 0) {
                      retval = IDASetLinearSolver(returnvalue_02,returnvalue_04,local_78);
                      iVar2 = check_retval(&retval,"IDASetLinearSolver",1);
                      iVar3 = 1;
                      if (iVar2 == 0) {
                        retval = IDASetJacFn(returnvalue_02,jacrob);
                        iVar2 = check_retval(&retval,"IDASetJacFn",1);
                        iVar3 = 1;
                        if (iVar2 == 0) {
                          local_80 = (void *)SUNNonlinSol_Newton(returnvalue,ctx);
                          iVar2 = check_retval(local_80,"SUNNonlinSol_Newton",0);
                          if (iVar2 == 0) {
                            retval = IDASetNonlinearSolver(returnvalue_02,local_80);
                            iVar2 = check_retval(&retval,"IDASetNonlinearSolver",1);
                            iVar3 = 1;
                            if (iVar2 == 0) {
                              local_a0 = 0.4;
                              local_8c = 0;
                              do {
                                retval = IDASolve(SUB84(local_a0,0),returnvalue_02,&tret,returnvalue
                                                  ,returnvalue_00,1);
                                sVar1 = tret;
                                returnvalue_02 = local_70;
                                puVar4 = (undefined8 *)N_VGetArrayPointer(returnvalue);
                                retval_1 = IDAGetLastOrder(returnvalue_02,&kused);
                                check_retval(&retval_1,"IDAGetLastOrder",1);
                                retval_1 = IDAGetNumSteps(returnvalue_02,&nst);
                                check_retval(&retval_1,"IDAGetNumSteps",1);
                                retval_1 = IDAGetLastStep(returnvalue_02,&hused);
                                check_retval(&retval_1,"IDAGetLastStep",1);
                                printf("%10.4e %12.4e %12.4e %12.4e | %3ld  %1d %12.4e\n",
                                       SUB84(sVar1,0),*puVar4,puVar4[1],puVar4[2],hused,nst,
                                       (ulong)(uint)kused);
                                iVar3 = check_retval(&retval,"IDASolve",1);
                                if (iVar3 != 0) {
                                  return 1;
                                }
                                if (retval == 2) {
                                  retvalr = IDAGetRootInfo(returnvalue_02,rootsfound);
                                  check_retval(&retvalr,"IDAGetRootInfo",1);
                                  printf("    rootsfound[] = %3d %3d\n",(ulong)(uint)rootsfound[0],
                                         (ulong)(uint)rootsfound[1]);
                                }
                                dVar10 = local_a0 * 10.0;
                                if (retval != 0) {
                                  dVar10 = local_a0;
                                }
                                local_8c = local_8c + (uint)(retval == 0);
                                local_a0 = dVar10;
                              } while (local_8c != 0xc);
                              puts("\nFinal Statistics:");
                              retval = IDAPrintAllStats(returnvalue_02,_stdout,0);
                              __stream = fopen("idasRoberts_dns_stats.csv","w");
                              retval = IDAPrintAllStats(returnvalue_02,__stream,1);
                              fclose(__stream);
                              plVar7 = (long *)N_VClone(returnvalue);
                              uVar8 = N_VClone(returnvalue);
                              puVar5 = *(undefined4 **)(*plVar7 + 0x10);
                              *puVar5 = 0x567623ed;
                              puVar5[1] = 0x3e6bf64c;
                              puVar5[2] = 0x238bb03e;
                              puVar5[3] = 0x3d4d5205;
                              *(undefined8 *)(puVar5 + 4) = 0x3fefffffe409ac56;
                              N_VAbs(plVar7,uVar8);
                              N_VLinearSum(0xeb1c432d,uVar8,returnvalue_01,uVar8);
                              dVar10 = (double)N_VMin(uVar8);
                              if (dVar10 <= 0.0) {
                                fwrite("\nSUNDIALS_ERROR: check_ans failed - ewt <= 0\n\n",0x2e,1,
                                       _stderr);
                                uVar9 = 0xffffffff;
                              }
                              else {
                                N_VInv(uVar8,uVar8);
                                N_VLinearSum(0,0xbff0000000000000,returnvalue,plVar7,plVar7);
                                dVar10 = (double)N_VWrmsNorm(plVar7,uVar8);
                                local_a0 = (double)CONCAT71(local_a0._1_7_,1.0 <= dVar10);
                                if (1.0 <= dVar10) {
                                  fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n");
                                }
                                uVar9 = (uint)local_a0._0_1_;
                                N_VDestroy(plVar7);
                                N_VDestroy(uVar8);
                              }
                              retval = uVar9;
                              IDAFree(&local_70);
                              SUNNonlinSolFree(local_80);
                              SUNLinSolFree(returnvalue_04);
                              SUNMatDestroy(local_78);
                              N_VDestroy(returnvalue_01);
                              N_VDestroy(returnvalue);
                              N_VDestroy(returnvalue_00);
                              SUNContext_Free(&ctx);
                              iVar3 = retval;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int main(void)
{
  void* mem;
  N_Vector yy, yp, avtol;
  sunrealtype rtol, *yval, *ypval, *atval;
  sunrealtype t0, tout1, tout, tret;
  int iout, retval, retvalr;
  int rootsfound[2];
  SUNMatrix A;
  SUNLinearSolver LS;
  SUNNonlinearSolver NLS;
  SUNContext ctx;
  FILE* FID;

  mem = NULL;
  yy = yp = avtol = NULL;
  yval = ypval = atval = NULL;
  A                    = NULL;
  LS                   = NULL;
  NLS                  = NULL;

  /* Create SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Allocate N-vectors. */
  yy = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)yy, "N_VNew_Serial", 0)) { return (1); }
  yp = N_VClone(yy);
  if (check_retval((void*)yp, "N_VNew_Serial", 0)) { return (1); }
  avtol = N_VClone(yy);
  if (check_retval((void*)avtol, "N_VNew_Serial", 0)) { return (1); }

  /* Create and initialize  y, y', and absolute tolerance vectors. */
  yval    = N_VGetArrayPointer(yy);
  yval[0] = ONE;
  yval[1] = ZERO;
  yval[2] = ZERO;

  ypval    = N_VGetArrayPointer(yp);
  ypval[0] = SUN_RCONST(-0.04);
  ypval[1] = SUN_RCONST(0.04);
  ypval[2] = ZERO;

  rtol = SUN_RCONST(1.0e-4);

  atval    = N_VGetArrayPointer(avtol);
  atval[0] = SUN_RCONST(1.0e-8);
  atval[1] = SUN_RCONST(1.0e-6);
  atval[2] = SUN_RCONST(1.0e-6);

  /* Integration limits */
  t0    = ZERO;
  tout1 = SUN_RCONST(0.4);

  PrintHeader(rtol, avtol, yy);

  /* Call IDACreate and IDAInit to initialize IDA memory */
  mem = IDACreate(ctx);
  if (check_retval((void*)mem, "IDACreate", 0)) { return (1); }
  retval = IDAInit(mem, resrob, t0, yy, yp);
  if (check_retval(&retval, "IDAInit", 1)) { return (1); }
  /* Call IDASVtolerances to set tolerances */
  retval = IDASVtolerances(mem, rtol, avtol);
  if (check_retval(&retval, "IDASVtolerances", 1)) { return (1); }

  /* Call IDARootInit to specify the root function grob with 2 components */
  retval = IDARootInit(mem, 2, grob);
  if (check_retval(&retval, "IDARootInit", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object */
  LS = SUNLinSol_Dense(yy, A, ctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = IDASetLinearSolver(mem, LS, A);
  if (check_retval(&retval, "IDASetLinearSolver", 1)) { return (1); }

  /* Set the user-supplied Jacobian routine */
  retval = IDASetJacFn(mem, jacrob);
  if (check_retval(&retval, "IDASetJacFn", 1)) { return (1); }

  /* Create Newton SUNNonlinearSolver object. IDA uses a
   * Newton SUNNonlinearSolver by default, so it is unnecessary
   * to create it and attach it. It is done in this example code
   * solely for demonstration purposes. */
  NLS = SUNNonlinSol_Newton(yy, ctx);
  if (check_retval((void*)NLS, "SUNNonlinSol_Newton", 0)) { return (1); }

  /* Attach the nonlinear solver */
  retval = IDASetNonlinearSolver(mem, NLS);
  if (check_retval(&retval, "IDASetNonlinearSolver", 1)) { return (1); }

  /* In loop, call IDASolve, print results, and test for error.
     Break out of loop when NOUT preset output times have been reached. */

  iout = 0;
  tout = tout1;
  while (1)
  {
    retval = IDASolve(mem, tout, &tret, yy, yp, IDA_NORMAL);

    PrintOutput(mem, tret, yy);

    if (check_retval(&retval, "IDASolve", 1)) { return (1); }

    if (retval == IDA_ROOT_RETURN)
    {
      retvalr = IDAGetRootInfo(mem, rootsfound);
      check_retval(&retvalr, "IDAGetRootInfo", 1);
      PrintRootInfo(rootsfound[0], rootsfound[1]);
    }

    if (retval == IDA_SUCCESS)
    {
      iout++;
      tout *= SUN_RCONST(10.0);
    }

    if (iout == NOUT) { break; }
  }

  /* Print final statistics to the screen */
  printf("\nFinal Statistics:\n");
  retval = IDAPrintAllStats(mem, stdout, SUN_OUTPUTFORMAT_TABLE);

  /* Print final statistics to a file in CSV format */
  FID    = fopen("idasRoberts_dns_stats.csv", "w");
  retval = IDAPrintAllStats(mem, FID, SUN_OUTPUTFORMAT_CSV);
  fclose(FID);

  /* check the solution error */
  retval = check_ans(yy, tret, rtol, avtol);

  /* Free memory */
  IDAFree(&mem);
  SUNNonlinSolFree(NLS);
  SUNLinSolFree(LS);
  SUNMatDestroy(A);
  N_VDestroy(avtol);
  N_VDestroy(yy);
  N_VDestroy(yp);
  SUNContext_Free(&ctx);

  return (retval);
}